

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::LowerNewScObjectSimple(Lowerer *this,Instr *instr)

{
  bool bVar1;
  Opnd *pOVar2;
  RegOpnd *newObjDst;
  LibraryValue valueType;
  Instr *instr_local;
  Lowerer *this_local;
  
  pOVar2 = IR::Instr::UnlinkDst(instr);
  newObjDst = IR::Opnd::AsRegOpnd(pOVar2);
  bVar1 = Js::FunctionBody::DoObjectHeaderInliningForEmptyObjects();
  valueType = ValueObjectType;
  if (bVar1) {
    valueType = ValueObjectHeaderInlinedType;
  }
  pOVar2 = LoadLibraryValueOpnd(this,instr,valueType);
  GenerateDynamicObjectAlloc(this,instr,0,0,newObjDst,pOVar2);
  IR::Instr::Remove(instr);
  return;
}

Assistant:

void
Lowerer::LowerNewScObjectSimple(IR::Instr * instr)
{
    GenerateDynamicObjectAlloc(
        instr,
        0,
        0,
        instr->UnlinkDst()->AsRegOpnd(),
        LoadLibraryValueOpnd(
            instr,
            Js::FunctionBody::DoObjectHeaderInliningForEmptyObjects()
                ? LibraryValue::ValueObjectHeaderInlinedType
                : LibraryValue::ValueObjectType));
    instr->Remove();
}